

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextElementTable.h
# Opt level: O0

void __thiscall
psy::TextElementTable<psy::C::FloatingConstant>::rehash
          (TextElementTable<psy::C::FloatingConstant> *this)

{
  int iVar1;
  TextElement *this_00;
  uint uVar2;
  FloatingConstant **ppFVar3;
  uint h;
  FloatingConstant *cur;
  FloatingConstant **it;
  FloatingConstant **last;
  TextElementTable<psy::C::FloatingConstant> *this_local;
  
  if (this->buckets_ != (FloatingConstant **)0x0) {
    free(this->buckets_);
  }
  if (this->bucketCount_ == 0) {
    this->bucketCount_ = 4;
  }
  else {
    this->bucketCount_ = this->bucketCount_ << 1;
  }
  ppFVar3 = (FloatingConstant **)calloc((long)this->bucketCount_,8);
  this->buckets_ = ppFVar3;
  ppFVar3 = this->elements_;
  iVar1 = this->count_;
  for (cur = (FloatingConstant *)this->elements_; cur != (FloatingConstant *)(ppFVar3 + (iVar1 + 1))
      ; cur = (FloatingConstant *)&(cur->super_Lexeme).field_0x8) {
    this_00 = *(TextElement **)&cur->super_Lexeme;
    uVar2 = TextElement::hashCode(this_00);
    uVar2 = uVar2 % (uint)this->bucketCount_;
    *(FloatingConstant **)(this_00 + 0x20) = this->buckets_[uVar2];
    this->buckets_[uVar2] = (FloatingConstant *)this_00;
  }
  return;
}

Assistant:

void rehash()
    {
       if (buckets_)
           std::free(buckets_);

       if (!bucketCount_)
           bucketCount_ = 4;
       else
           bucketCount_ <<= 1;

       buckets_ = (ElemT**)std::calloc(bucketCount_, sizeof(ElemT*));

       ElemT** last = elements_ + (count_ + 1);
       for (ElemT** it = elements_; it != last; ++it) {
           ElemT* cur = *it;
           unsigned int h = cur->hashCode() % bucketCount_;
           cur->next_ = buckets_[h];
           buckets_[h] = cur;
       }
    }